

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Header.cpp
# Opt level: O0

string * to_string_abi_cxx11_(string *__return_storage_ptr__,DataRate *datarate)

{
  DataRate DVar1;
  allocator<char> local_30;
  allocator<char> local_2f;
  allocator<char> local_2e;
  allocator<char> local_2d [20];
  allocator<char> local_19;
  DataRate *local_18;
  DataRate *datarate_local;
  
  DVar1 = *datarate;
  local_18 = datarate;
  datarate_local = (DataRate *)__return_storage_ptr__;
  if (DVar1 != Unknown) {
    if (DVar1 == _250K) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"250Kbps",&local_19);
      std::allocator<char>::~allocator(&local_19);
      return __return_storage_ptr__;
    }
    if (DVar1 == _300K) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"300Kbps",local_2d);
      std::allocator<char>::~allocator(local_2d);
      return __return_storage_ptr__;
    }
    if (DVar1 == _500K) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"500Kbps",&local_2e);
      std::allocator<char>::~allocator(&local_2e);
      return __return_storage_ptr__;
    }
    if (DVar1 == _1M) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"1Mbps",&local_2f);
      std::allocator<char>::~allocator(&local_2f);
      return __return_storage_ptr__;
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"Unknown",&local_30);
  std::allocator<char>::~allocator(&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const DataRate& datarate)
{
    switch (datarate)
    {
    case DataRate::_250K:   return "250Kbps";       break;
    case DataRate::_300K:   return "300Kbps";       break;
    case DataRate::_500K:   return "500Kbps";       break;
    case DataRate::_1M:     return "1Mbps";         break;
    case DataRate::Unknown: break;
    }
    return "Unknown";
}